

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

bool __thiscall QComboBox::event(QComboBox *this,QEvent *event)

{
  ushort uVar1;
  QComboBoxPrivate *this_00;
  QLineEdit *pQVar2;
  bool bVar3;
  undefined1 uVar4;
  QHoverEvent *he;
  long in_FS_OFFSET;
  double dVar5;
  undefined1 auVar6 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x7f) {
    if (uVar1 == 0x25) {
LAB_003dbfe7:
      QComboBoxPrivate::updateLayoutDirection(this_00);
      QComboBoxPrivate::updateLineEditGeometry(this_00);
    }
    else if (uVar1 == 0x33) {
      pQVar2 = this_00->lineEdit;
      if (pQVar2 != (QLineEdit *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          uVar4 = (**(code **)(*(long *)&pQVar2->super_QWidget + 0x28))(pQVar2,event);
          return (bool)uVar4;
        }
        goto LAB_003dc0fa;
      }
    }
    else if (uVar1 == 0x5a) goto LAB_003dbfe7;
  }
  else if (uVar1 - 0x7f < 3) {
    auVar6 = QEventPoint::position();
    dVar5 = (double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._0_8_;
    bVar3 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_28.xp.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar5);
    dVar5 = (double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._8_8_;
    bVar3 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_28.yp.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar5);
    QComboBoxPrivate::updateHoverControl(this_00,&local_28);
  }
  bVar3 = QWidget::event(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
LAB_003dc0fa:
  __stack_chk_fail();
}

Assistant:

bool QComboBox::event(QEvent *event)
{
    Q_D(QComboBox);
    switch(event->type()) {
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
        d->updateLayoutDirection();
        d->updateLineEditGeometry();
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d->updateHoverControl(he->position().toPoint());
        break;
    case QEvent::ShortcutOverride:
        if (d->lineEdit)
            return d->lineEdit->event(event);
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
        if (d->lineEdit)
            d->lineEdit->event(event);  //so cursor starts
        break;
    case QEvent::LeaveEditFocus:
        if (d->lineEdit)
            d->lineEdit->event(event);  //so cursor stops
        break;
#endif
    default:
        break;
    }
    return QWidget::event(event);
}